

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

bool __thiscall QPDFObjectHandle::isFormXObject(QPDFObjectHandle *this)

{
  bool bVar1;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  QPDFObjectHandle *local_10;
  QPDFObjectHandle *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"/Form",&local_69);
  bVar1 = isStreamOfType(this,&local_30,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return bVar1;
}

Assistant:

bool
QPDFObjectHandle::isFormXObject() const
{
    return isStreamOfType("", "/Form");
}